

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadQuadMesh(XMLLoader *this,Ref<embree::XML> *xml)

{
  __int_type_conflict1 *p_Var1;
  string *psVar2;
  void *pvVar3;
  pointer *ppQVar4;
  XMLLoader *pXVar5;
  QuadMeshNode *this_00;
  size_t in_RCX;
  pointer in_RDX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *sig;
  ulong uVar6;
  iterator __position;
  uchar *in_R8;
  size_t in_R9;
  long lVar7;
  Ref<embree::XML> animation;
  vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> indices;
  Ref<embree::SceneGraph::MaterialNode> material;
  Ref<embree::XML> local_b0;
  __atomic_base<unsigned_long> local_a8;
  element_type *peStack_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_98;
  Vec3fa *local_90;
  undefined1 local_88 [64];
  undefined1 local_48 [16];
  XMLLoader *local_38;
  
  psVar2 = *(string **)in_RDX;
  local_a8._M_i = (__int_type_conflict1)&_Stack_98;
  local_88._40_8_ = xml;
  local_88._48_8_ = in_RDX;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"material","");
  XML::child((XML *)local_88,psVar2);
  loadMaterial((XMLLoader *)(local_48 + 8),(Ref<embree::XML> *)local_88._40_8_);
  if ((anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_88._0_8_ !=
      (anon_union_8_2_4062524c_for_Vec2<float>_1 *)0x0) {
    (**(code **)((long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_88._0_8_ + 0x18))();
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_i != &_Stack_98) {
    operator_delete((void *)local_a8._M_i);
  }
  this_00 = (QuadMeshNode *)operator_new(0xd8);
  local_48._0_8_ = local_48._8_8_;
  if ((long *)local_48._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_48._8_8_ + 0x10))();
  }
  SceneGraph::QuadMeshNode::QuadMeshNode
            (this_00,(Ref<embree::SceneGraph::MaterialNode> *)local_48,(BBox1f)0x3f80000000000000,0)
  ;
  (**(code **)((long)(this_00->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_00);
  local_38 = this;
  if ((long *)local_48._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_48._0_8_ + 0x18))();
  }
  psVar2 = *(string **)local_88._48_8_;
  local_a8._M_i = (__int_type_conflict1)&_Stack_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"animated_positions","");
  XML::childOpt((XML *)&local_b0,psVar2);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_i != &_Stack_98) {
    operator_delete((void *)local_a8._M_i);
  }
  if (local_b0.ptr == (XML *)0x0) {
    psVar2 = *(string **)local_88._48_8_;
    local_88._0_8_ = (anon_union_8_2_4062524c_for_Vec2<float>_1 *)(local_88 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"positions","");
    XML::childOpt((XML *)(local_88 + 0x38),psVar2);
    loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)local_88._40_8_,
                    (Ref<embree::XML> *)(local_88 + 0x38));
    std::
    vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
              ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                *)&this_00->positions,
               (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
               &local_a8);
    alignedFree(local_90);
    peStack_a0 = (element_type *)0x0;
    _Stack_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_90 = (Vec3fa *)0x0;
    if ((_Base_ptr)local_88._56_8_ != (_Base_ptr)0x0) {
      (**(code **)(*(long *)(_Rb_tree_color *)local_88._56_8_ + 0x18))();
    }
    if ((anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_88._0_8_ !=
        (anon_union_8_2_4062524c_for_Vec2<float>_1 *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
  }
  else if (((local_b0.ptr)->children).
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
           _M_impl.super__Vector_impl_data._M_finish !=
           ((local_b0.ptr)->children).
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
           _M_impl.super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      XML::child((XML *)local_88,(size_t)local_b0.ptr);
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)local_88._40_8_,
                      (Ref<embree::XML> *)local_88);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)&this_00->positions,(avector<Vec3fa> *)&local_a8);
      alignedFree(local_90);
      peStack_a0 = (element_type *)0x0;
      _Stack_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_90 = (Vec3fa *)0x0;
      if ((anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_88._0_8_ !=
          (anon_union_8_2_4062524c_for_Vec2<float>_1 *)0x0) {
        (**(code **)((long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_88._0_8_ + 0x18))();
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)((local_b0.ptr)->children).
                                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)((local_b0.ptr)->children).
                                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  psVar2 = *(string **)local_88._48_8_;
  local_a8._M_i = (__int_type_conflict1)&_Stack_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"animated_normals","");
  XML::childOpt((XML *)local_88,psVar2);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_i != &_Stack_98) {
    operator_delete((void *)local_a8._M_i);
  }
  if ((anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_88._0_8_ ==
      (anon_union_8_2_4062524c_for_Vec2<float>_1 *)0x0) {
    psVar2 = *(string **)local_88._48_8_;
    local_a8._M_i = (__int_type_conflict1)&_Stack_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"normals","");
    XML::childOpt((XML *)&local_b0,psVar2);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_i != &_Stack_98) {
      operator_delete((void *)local_a8._M_i);
    }
    if (local_b0.ptr != (XML *)0x0) {
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)local_88._40_8_,&local_b0);
      if ((peStack_a0 != (element_type *)0x0) &&
         ((this_00->positions).
          super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this_00->positions).
          super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)) {
        uVar6 = 0;
        do {
          std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::push_back(&this_00->normals,(value_type *)&local_a8);
          uVar6 = uVar6 + 1;
        } while (uVar6 < (ulong)((long)(this_00->positions).
                                       super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this_00->positions).
                                       super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      alignedFree(local_90);
      peStack_a0 = (element_type *)0x0;
      _Stack_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_90 = (Vec3fa *)0x0;
    }
    if (local_b0.ptr != (XML *)0x0) {
      (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
  }
  else if (*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)(local_88._0_8_ + 0x88) !=
           *(anon_union_8_2_4062524c_for_Vec2<float>_1 *)(local_88._0_8_ + 0x80)) {
    uVar6 = 0;
    do {
      XML::child((XML *)&local_b0,local_88._0_8_);
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)local_88._40_8_,&local_b0);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)&this_00->normals,(avector<Vec3fa> *)&local_a8);
      alignedFree(local_90);
      peStack_a0 = (element_type *)0x0;
      _Stack_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_90 = (Vec3fa *)0x0;
      if (local_b0.ptr != (XML *)0x0) {
        (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)
                                    (local_88._0_8_ + 0x88) -
                             (long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)
                                    (local_88._0_8_ + 0x80) >> 3));
  }
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    (**(code **)((long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_88._0_8_ + 0x18))();
  }
  psVar2 = *(string **)local_88._48_8_;
  local_a8._M_i = (__int_type_conflict1)&_Stack_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"texcoords","");
  XML::childOpt((XML *)&local_b0,psVar2);
  loadVec2fArray((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)local_88,
                 (XMLLoader *)local_88._40_8_,&local_b0);
  pvVar3 = (this_00->texcoords).
           super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this_00->texcoords).
  super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_88._0_8_;
  (this_00->texcoords).
  super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_88._8_8_;
  (this_00->texcoords).
  super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_88._16_8_;
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = (element_type *)0x0;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3);
  }
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._0_8_);
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_i != &_Stack_98) {
    operator_delete((void *)local_a8._M_i);
  }
  psVar2 = *(string **)local_88._48_8_;
  local_a8._M_i = (__int_type_conflict1)&_Stack_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"indices","");
  XML::childOpt((XML *)&local_b0,psVar2);
  __position._M_current = (Quad *)local_88._40_8_;
  loadVec4iArray((vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> *)local_88,
                 (XMLLoader *)local_88._40_8_,&local_b0);
  sig = extraout_RDX;
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
    sig = extraout_RDX_00;
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_i != &_Stack_98) {
    operator_delete((void *)local_a8._M_i);
    sig = extraout_RDX_01;
  }
  if (local_88._8_8_ != local_88._0_8_) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      p_Var1 = (__int_type_conflict1 *)
               ((long)(anon_union_16_2_4062524c_for_Vec4<int>_1 *)local_88._0_8_ + lVar7);
      local_a8._M_i = *p_Var1;
      peStack_a0 = (element_type *)p_Var1[1];
      __position._M_current =
           (this_00->quads).
           super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this_00->quads).
          super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
        ::_M_realloc_insert<embree::SceneGraph::QuadMeshNode::Quad>
                  (&this_00->quads,__position,(Quad *)&local_a8);
        sig = extraout_RDX_02;
      }
      else {
        (__position._M_current)->v0 = (int)local_a8._M_i;
        (__position._M_current)->v1 = (int)(local_a8._M_i >> 0x20);
        *(element_type **)&(__position._M_current)->v2 = peStack_a0;
        ppQVar4 = &(this_00->quads).
                   super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppQVar4 = *ppQVar4 + 1;
      }
      uVar6 = uVar6 + 1;
      in_RCX = (long)(local_88._8_8_ - local_88._0_8_) >> 4;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < in_RCX);
  }
  SceneGraph::QuadMeshNode::verify
            (this_00,(EVP_PKEY_CTX *)__position._M_current,sig,in_RCX,in_R8,in_R9);
  pXVar5 = local_38;
  (local_38->path).filename._M_dataplus._M_p = (pointer)this_00;
  (**(code **)((long)(this_00->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_00);
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._0_8_);
  }
  (**(code **)((long)(this_00->super_Node).super_RefCount._vptr_RefCount + 0x18))(this_00);
  if ((long *)local_48._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_48._8_8_ + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)pXVar5;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadQuadMesh(const Ref<XML>& xml) 
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::QuadMeshNode> mesh = new SceneGraph::QuadMeshNode(material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->positions.push_back(loadVec3faArray(animation->child(i)));
    } else {
      mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions")));
    }

    if (Ref<XML> animation = xml->childOpt("animated_normals")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->normals.push_back(loadVec3faArray(animation->child(i)));
    }
    else if (Ref<XML> normalbuf = xml->childOpt("normals")) {
      auto vec = loadVec3faArray(normalbuf);
      if (vec.size())
        for (size_t i=0; i<mesh->numTimeSteps(); i++)
          mesh->normals.push_back(vec);
    }
  
    mesh->texcoords = loadVec2fArray(xml->childOpt("texcoords"));

    std::vector<Vec4i> indices = loadVec4iArray(xml->childOpt("indices"));
    for (size_t i=0; i<indices.size(); i++) 
      mesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(indices[i].x,indices[i].y,indices[i].z,indices[i].w));
    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }